

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

void order_unassigned(sat_solver2 *s,int v)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  if (s->orderpos[v] == -1) {
    s->orderpos[v] = (s->order).size;
    uVar9 = (s->order).cap;
    if ((s->order).size == uVar9) {
      iVar6 = (uVar9 >> 1) * 3;
      if ((int)uVar9 < 4) {
        iVar6 = uVar9 * 2;
      }
      piVar5 = (s->order).ptr;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar6 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)iVar6 << 2);
      }
      (s->order).ptr = piVar5;
      if (piVar5 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->order).cap * 9.5367431640625e-07,(double)iVar6 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->order).cap = iVar6;
    }
    iVar6 = (s->order).size;
    (s->order).size = iVar6 + 1;
    (s->order).ptr[iVar6] = v;
    piVar5 = s->orderpos;
    piVar2 = (s->order).ptr;
    uVar9 = piVar5[v];
    uVar7 = (ulong)(int)uVar9;
    iVar6 = piVar2[uVar7];
    if (uVar7 != 0) {
      if (uVar9 == 0xffffffff) {
        __assert_fail("s->orderpos[v] != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0xf2,"void order_update(sat_solver2 *, int)");
      }
      puVar3 = s->activity;
      do {
        uVar4 = (uint)uVar7;
        uVar8 = (int)((uVar4 - ((int)(uVar4 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar2[(int)uVar8];
        uVar9 = uVar4;
        if (puVar3[iVar6] <= puVar3[iVar1]) break;
        piVar2[(int)uVar4] = iVar1;
        piVar5[iVar1] = uVar4;
        uVar7 = (ulong)uVar8;
        uVar9 = uVar8;
      } while (2 < uVar4);
    }
    piVar2[(int)uVar9] = iVar6;
    piVar5[iVar6] = uVar9;
  }
  return;
}

Assistant:

static inline void order_unassigned(sat_solver* s, int v) // undoorder
{
    int* orderpos = s->orderpos;
    if (orderpos[v] == -1){
        orderpos[v] = veci_size(&s->order);
        veci_push(&s->order,v);
        order_update(s,v);
//printf( "+%d ", v );
    }
}